

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O1

void __thiscall
OpenMD::ForceManager::calcSelectedForces(ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  if (this->initialized_ == false) {
    initialize(this);
  }
  (*this->_vptr_ForceManager[9])(this,mol1,mol2);
  (*this->_vptr_ForceManager[10])(this,mol1,mol2);
  (*this->_vptr_ForceManager[0xb])(this,mol1,mol2);
  (*this->_vptr_ForceManager[0xc])(this,mol1,mol2);
  return;
}

Assistant:

void ForceManager::calcSelectedForces(Molecule* mol1, Molecule* mol2) {
    if (!initialized_) initialize();

    selectedPreCalculation(mol1, mol2);
    selectedShortRangeInteractions(mol1, mol2);
    selectedLongRangeInteractions(mol1, mol2);
    selectedPostCalculation(mol1, mol2);
  }